

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ColumnDefault(Vdbe *v,Table *pTab,int i,int iReg)

{
  Column *pCol;
  u8 enc;
  sqlite3 *db;
  Expr *pExpr;
  long in_FS_OFFSET;
  sqlite3_value *pValue;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCol = pTab->aCol + i;
  if (pTab->aCol[i].iDflt != 0) {
    pValue = (sqlite3_value *)0x0;
    db = v->db;
    enc = db->enc;
    pExpr = sqlite3ColumnExpr(pTab,pCol);
    sqlite3ValueFromExpr(db,pExpr,enc,pCol->affinity,&pValue);
    if (pValue != (sqlite3_value *)0x0) {
      sqlite3VdbeAppendP4(v,pValue,-10);
    }
  }
  if ((pCol->affinity == 'E') && (pTab->eTabType != '\x01')) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3VdbeAddOp1(v,0x57,iReg);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnDefault(Vdbe *v, Table *pTab, int i, int iReg){
  Column *pCol;
  assert( pTab!=0 );
  assert( pTab->nCol>i );
  pCol = &pTab->aCol[i];
  if( pCol->iDflt ){
    sqlite3_value *pValue = 0;
    u8 enc = ENC(sqlite3VdbeDb(v));
    assert( !IsView(pTab) );
    VdbeComment((v, "%s.%s", pTab->zName, pCol->zCnName));
    assert( i<pTab->nCol );
    sqlite3ValueFromExpr(sqlite3VdbeDb(v),
                         sqlite3ColumnExpr(pTab,pCol), enc,
                         pCol->affinity, &pValue);
    if( pValue ){
      sqlite3VdbeAppendP4(v, pValue, P4_MEM);
    }
  }
#ifndef SQLITE_OMIT_FLOATING_POINT
  if( pCol->affinity==SQLITE_AFF_REAL && !IsVirtual(pTab) ){
    sqlite3VdbeAddOp1(v, OP_RealAffinity, iReg);
  }
#endif
}